

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

void MARGINAL::predict_or_learn<true>(data *sm,single_learner *base,example *ec)

{
  float fVar1;
  
  make_marginal<true>(sm,ec);
  if (sm->update_before_learn == true) {
    LEARNER::learner<char,_example>::predict(base,ec,0);
    fVar1 = (ec->pred).scalar;
    if (sm->compete == true) {
      sm->feature_pred = fVar1;
      compute_expert_loss<true>(sm,ec);
    }
    undo_marginal(sm,ec);
    update_marginal(sm,ec);
    make_marginal<true>(sm,ec);
    LEARNER::learner<char,_example>::learn(base,ec,0);
    (ec->pred).scalar = fVar1;
  }
  else {
    LEARNER::learner<char,_example>::learn(base,ec,0);
    if (sm->compete == true) {
      sm->feature_pred = (ec->pred).scalar;
      compute_expert_loss<true>(sm,ec);
    }
    update_marginal(sm,ec);
  }
  undo_marginal(sm,ec);
  return;
}

Assistant:

void predict_or_learn(data& sm, LEARNER::single_learner& base, example& ec)
{
  make_marginal<is_learn>(sm, ec);
  if (is_learn)
    if (sm.update_before_learn)
    {
      base.predict(ec);
      float pred = ec.pred.scalar;
      if (sm.compete)
      {
        sm.feature_pred = pred;
        compute_expert_loss<is_learn>(sm, ec);
      }
      undo_marginal(sm, ec);
      update_marginal(sm, ec);  // update features before learning.
      make_marginal<is_learn>(sm, ec);
      base.learn(ec);
      ec.pred.scalar = pred;
    }
    else
    {
      base.learn(ec);
      if (sm.compete)
      {
        sm.feature_pred = ec.pred.scalar;
        compute_expert_loss<is_learn>(sm, ec);
      }
      update_marginal(sm, ec);
    }
  else
  {
    base.predict(ec);
    float pred = ec.pred.scalar;
    if (sm.compete)
    {
      sm.feature_pred = pred;
      compute_expert_loss<is_learn>(sm, ec);
    }
  }

  // undo marginalization
  undo_marginal(sm, ec);
}